

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O3

void __thiscall
cfd::js::api::json::DescriptorKeyJson::ConvertFromStruct
          (DescriptorKeyJson *this,DescriptorKeyJsonStruct *data)

{
  std::__cxx11::string::_M_assign((string *)&this->key_type_);
  std::__cxx11::string::_M_assign((string *)&this->key_);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->ignore_items)._M_t,&(data->ignore_items)._M_t);
  return;
}

Assistant:

void DescriptorKeyJson::ConvertFromStruct(
    const DescriptorKeyJsonStruct& data) {
  key_type_ = data.key_type;
  key_ = data.key;
  ignore_items = data.ignore_items;
}